

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

work_t __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getBilinear
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,float x,float y,int j)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  work_t ret;
  store_t_conflict p3;
  store_t_conflict p2;
  store_t_conflict p1;
  store_t_conflict p0;
  long k;
  long i;
  store_t_conflict v;
  undefined4 in_stack_ffffffffffffffc0;
  int local_38;
  work_t local_34;
  ushort local_30;
  ushort local_2e;
  ushort local_2c;
  ushort local_2a;
  long local_28;
  long local_20;
  int local_14;
  float local_10;
  float local_c;
  
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  local_34 = PixelTraits<unsigned_short>::invalid();
  local_38 = 0;
  piVar3 = std::max<int>(&local_38,&local_14);
  local_14 = *piVar3;
  iVar2 = *in_RDI + -1;
  piVar3 = std::min<int>((int *)&stack0xffffffffffffffc4,&local_14);
  local_14 = *piVar3;
  local_c = local_c - 0.5;
  local_10 = local_10 - 0.5;
  if (local_c < 0.0) {
    local_c = 0.0;
  }
  if (local_10 < 0.0) {
    local_10 = 0.0;
  }
  if ((float)(*(long *)(in_RDI + 2) + -1) <= local_c) {
    local_c = (float)*(long *)(in_RDI + 2) - 1.001;
  }
  if ((float)(*(long *)(in_RDI + 4) + -1) <= local_10) {
    local_10 = (float)*(long *)(in_RDI + 4) - 1.001;
  }
  local_20 = (long)local_c;
  local_28 = (long)local_10;
  local_c = local_c - (float)local_20;
  local_10 = local_10 - (float)local_28;
  local_2a = *(ushort *)
              (*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_14 * 8) + local_28 * 8) +
              local_20 * 2);
  local_2c = *(ushort *)
              (*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_14 * 8) + local_28 * 8) + 2
              + local_20 * 2);
  local_2e = *(ushort *)
              (*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_14 * 8) + 8 + local_28 * 8)
              + local_20 * 2);
  local_30 = *(ushort *)
              (*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_14 * 8) + 8 + local_28 * 8)
               + 2 + local_20 * 2);
  v = (store_t_conflict)((ulong)in_RDI >> 0x30);
  bVar1 = isValidS((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                   CONCAT44(iVar2,in_stack_ffffffffffffffc0),v);
  if ((((bVar1) &&
       (bVar1 = isValidS((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                         CONCAT44(iVar2,in_stack_ffffffffffffffc0),v), bVar1)) &&
      (bVar1 = isValidS((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                        CONCAT44(iVar2,in_stack_ffffffffffffffc0),v), bVar1)) &&
     (bVar1 = isValidS((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                       CONCAT44(iVar2,in_stack_ffffffffffffffc0),v), bVar1)) {
    local_c = local_c * 4.0;
    local_10 = local_10 * 4.0;
    local_34 = (int)((float)local_30 * local_c * local_10 +
                    (float)local_2e * (4.0 - local_c) * local_10 +
                    (float)local_2a * (4.0 - local_c) * (4.0 - local_10) +
                    (float)local_2c * local_c * (4.0 - local_10)) / 0x10;
  }
  return local_34;
}

Assistant:

work_t getBilinear(float x, float y, int j=0) const
    {
      long    i, k;
      store_t p0, p1, p2, p3;
      work_t  ret=ptraits::invalid();

      j=std::max(0, j);
      j=std::min(depth-1, j);

      x-=0.5f;
      y-=0.5f;

      if (x < 0)
      {
        x=0;
      }

      if (y < 0)
      {
        y=0;
      }

      if (x >= width-1)
      {
        x=width-1.001f;
      }

      if (y >= height-1)
      {
        y=height-1.001f;
      }

      i=static_cast<long>(x);
      k=static_cast<long>(y);

      x-=i;
      y-=k;

      p0=img[j][k][i];
      p1=img[j][k][i+1];
      p2=img[j][k+1][i];
      p3=img[j][k+1][i+1];

      if (isValidS(p0) && isValidS(p1) && isValidS(p2) && isValidS(p3))
      {
        x*=4;
        y*=4;

        ret=static_cast<work_t>(p0*(4-x)*(4-y)+p1*x*(4-y)+p2*(4-x)*y+p3*x*y);
        ret/=16;
      }

      return ret;
    }